

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  string sVar1;
  char cVar2;
  size_t sVar3;
  runtime_error *this_00;
  string *psVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *comment;
  char buf [64];
  char print_buffer [32];
  char (*in_stack_fffffffffffffc90) [5];
  char *local_360;
  float local_354;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  string local_318;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [32];
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined1 local_288 [8];
  undefined4 local_280;
  undefined2 local_27c;
  undefined4 local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined1 local_258 [32];
  undefined1 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined8 local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1e0;
  char local_1a8 [40];
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined *local_170;
  undefined4 local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined4 local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_354 = (c->m).c[col].r[row].f32;
  if ((!NAN(local_354) && !NAN(local_354)) && ABS(local_354) != INFINITY) {
    sVar1 = (string)this->current_locale_radix_character;
    sprintf((char *)&local_2f8,"%.32g",SUB84((double)local_354,0));
    if (local_2f8._0_1_ != (string)0x0 && sVar1 != (string)0x2e) {
      psVar4 = (string *)((long)&local_2f8 + 1);
      do {
        if (local_2f8._0_1_ == sVar1) {
          psVar4[-1] = (string)0x2e;
        }
        local_2f8._0_1_ = *psVar4;
        psVar4 = psVar4 + 1;
      } while (local_2f8._0_1_ != (string)0x0);
    }
    pcVar5 = strchr((char *)&local_2f8,0x2e);
    if ((pcVar5 == (char *)0x0) && (pcVar5 = strchr((char *)&local_2f8,0x65), pcVar5 == (char *)0x0)
       ) {
      sVar3 = strlen((char *)&local_2f8);
      *(undefined2 *)((long)&local_2f8 + sVar3) = 0x302e;
      *(undefined1 *)((long)&local_2f8 + sVar3 + 2) = 0;
    }
    local_180 = &local_170;
    sVar3 = strlen((char *)&local_2f8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,&local_2f8,(long)&local_2f8 + sVar3);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180);
    }
    if ((this->backend).float_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar7 = 0x81;
  if ((this->options).es != false) {
    uVar7 = 299;
  }
  if (uVar7 < (this->options).version) {
    local_2d8 = local_2c0;
    local_2f0 = 0;
    local_2f8 = &PTR__SPIRType_003d5290;
    local_2e0 = 1;
    local_2d0 = 0;
    local_2c8 = 8;
    local_2a0 = local_288;
    local_298 = 0;
    local_290 = 8;
    local_280 = 0;
    local_27c = 0;
    local_278 = 8;
    local_340 = local_258;
    local_268 = 0;
    local_260 = 8;
    local_348 = local_220;
    local_230 = 0;
    local_228 = 8;
    local_200 = 0;
    local_1e8 = 0;
    local_1e0._M_buckets = &local_1e0._M_single_bucket;
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_003d5290;
    local_168 = 1;
    local_158 = 0;
    local_150 = 8;
    local_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_350 = auStack_e0;
    local_f0 = 0;
    local_e8 = 8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    local_70 = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_1e0._M_bucket_count = 1;
    local_68._M_bucket_count = 1;
    local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0._M_element_count = 0;
    local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0._M_rehash_policy._M_next_resize = 0;
    local_1e0._M_single_bucket = (__node_base_ptr)0x0;
    local_2ec = 0x200000000d;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 8;
    local_2e4 = 1;
    local_170 = (undefined *)0x100000020;
    local_270 = local_340;
    local_238 = local_348;
    local_128 = local_110;
    local_f8 = local_350;
    local_c0 = auStack_a8;
    snprintf(local_1a8,0x20,"0x%xu",(ulong)(c->m).c[col].r[row].u32);
    local_360 = "inf";
    if (-INFINITY < local_354) {
      if (NAN(local_354)) {
        local_360 = "nan";
      }
    }
    else {
      local_360 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_338,this,&local_2f8,&local_180);
    join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_318,(spirv_cross *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])local_1a8,(char (*) [32])" /* ",(char (*) [5])&local_360,
               (char **)" */)",in_stack_fffffffffffffc90);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    if (local_338[0] != local_328) {
      operator_delete(local_338[0]);
    }
    local_180 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != auStack_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_350) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_158 = 0;
    if (local_160 != local_148) {
      free(local_160);
    }
    local_2f8 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1e0);
    local_230 = 0;
    if (local_238 != local_348) {
      free(local_238);
    }
    local_268 = 0;
    if (local_270 != local_340) {
      free(local_270);
    }
    local_298 = 0;
    if (local_2a0 != local_288) {
      free(local_2a0);
    }
    local_2d0 = 0;
    if (local_2d8 == local_2c0) {
      return __return_storage_ptr__;
    }
    free(local_2d8);
    return __return_storage_ptr__;
  }
  if (local_354 < INFINITY) {
    if (local_354 <= -INFINITY) {
      pcVar5 = "(-1.0 / 0.0)";
      if ((this->backend).float_literal_suffix != false) {
        pcVar5 = "(-1.0f / 0.0f)";
      }
      goto LAB_001eaf8d;
    }
    if (!NAN(local_354)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_2f8 = (undefined **)((long)&local_2ec + 4);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Cannot represent non-finite floating point constant.","");
      ::std::runtime_error::runtime_error(this_00,(string *)&local_2f8);
      *(undefined ***)this_00 = &PTR__runtime_error_003d4e98;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar2 = (this->backend).float_literal_suffix;
    pcVar6 = "(0.0f / 0.0f)";
    pcVar5 = "(0.0 / 0.0)";
  }
  else {
    cVar2 = (this->backend).float_literal_suffix;
    pcVar6 = "(1.0f / 0.0f)";
    pcVar5 = "(1.0 / 0.0)";
  }
  if (cVar2 != '\0') {
    pcVar5 = pcVar6;
  }
LAB_001eaf8d:
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(float_value, current_locale_radix_character);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}